

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

int64_t __thiscall mocker::ir::Interpreter::run(Interpreter *this)

{
  bool bVar1;
  size_t sz;
  void *__dest;
  void *__src;
  size_t __n;
  mapped_type mVar2;
  mapped_type *pmVar3;
  int64_t iVar4;
  vector<long,_std::allocator<long>_> local_98;
  allocator<char> local_69;
  string local_68;
  void *local_48;
  void *res;
  string *data;
  string *ident;
  GlobalVar *var;
  iterator __end2;
  iterator __begin2;
  vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_> *__range2;
  Interpreter *this_local;
  
  __end2 = std::vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::begin
                     (&this->globalVars);
  var = (GlobalVar *)
        std::vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::end
                  (&this->globalVars);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<mocker::ir::GlobalVar_*,_std::vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>_>
                                *)&var);
    if (!bVar1) break;
    ident = &__gnu_cxx::
             __normal_iterator<mocker::ir::GlobalVar_*,_std::vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>_>
             ::operator*(&__end2)->label;
    data = GlobalVar::getLabel_abi_cxx11_((GlobalVar *)ident);
    res = GlobalVar::getData_abi_cxx11_((GlobalVar *)ident);
    sz = std::__cxx11::string::size();
    __dest = fastMalloc(this,sz);
    local_48 = __dest;
    __src = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    memcpy(__dest,__src,__n);
    mVar2 = std::__cxx11::string::c_str();
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&this->globalReg,data);
    *pmVar3 = mVar2;
    __gnu_cxx::
    __normal_iterator<mocker::ir::GlobalVar_*,_std::vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"main",&local_69);
  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector(&local_98);
  iVar4 = executeFunc(this,&local_68,&local_98);
  std::vector<long,_std::allocator<long>_>::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return iVar4;
}

Assistant:

std::int64_t Interpreter::run() {
  for (auto &var : globalVars) {
    auto &ident = var.getLabel();
    auto &data = var.getData();
    auto res = fastMalloc(data.size());
    std::memcpy(res, data.c_str(), data.size());
    globalReg[ident] = (std::int64_t)(data.c_str());
  }

  return executeFunc("main", {});
}